

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

TestPartResult * __thiscall
testing::TestPartResultArray::GetTestPartResult(TestPartResultArray *this,int index)

{
  int iVar1;
  const_reference pvVar2;
  uint in_ESI;
  vector<testing::TestPartResult,_std::allocator<testing::TestPartResult>_> *in_RDI;
  
  if (-1 < (int)in_ESI) {
    iVar1 = size((TestPartResultArray *)0x18bb40);
    if ((int)in_ESI < iVar1) goto LAB_0018bb61;
  }
  printf("\nInvalid index (%d) into TestPartResultArray.\n",(ulong)in_ESI);
  internal::posix::Abort();
LAB_0018bb61:
  pvVar2 = std::vector<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>::
           operator[](in_RDI,(long)(int)in_ESI);
  return pvVar2;
}

Assistant:

const TestPartResult& TestPartResultArray::GetTestPartResult(int index) const {
  if (index < 0 || index >= size()) {
    printf("\nInvalid index (%d) into TestPartResultArray.\n", index);
    internal::posix::Abort();
  }

  return array_[index];
}